

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O1

void __thiscall
irr::video::CNullDriver::getFog
          (CNullDriver *this,SColor *color,E_FOG_TYPE *fogType,f32 *start,f32 *end,f32 *density,
          bool *pixelFog,bool *rangeFog)

{
  color->color = (this->FogColor).color;
  *fogType = this->FogType;
  *start = this->FogStart;
  *end = this->FogEnd;
  *density = this->FogDensity;
  *pixelFog = this->PixelFog;
  *rangeFog = this->RangeFog;
  return;
}

Assistant:

void CNullDriver::getFog(SColor &color, E_FOG_TYPE &fogType, f32 &start, f32 &end,
		f32 &density, bool &pixelFog, bool &rangeFog)
{
	color = FogColor;
	fogType = FogType;
	start = FogStart;
	end = FogEnd;
	density = FogDensity;
	pixelFog = PixelFog;
	rangeFog = RangeFog;
}